

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_ComparableMap_Test::TestBody(Btree_ComparableMap_Test *this)

{
  allocator<std::pair<const_int,_int>_> *this_00;
  initializer_list<std::pair<int,_int>_> iVar1;
  initializer_list<std::pair<int,_int>_> iVar2;
  bool bVar3;
  char *pcVar4;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_5;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  int local_98 [2];
  pair<int,_int> local_90;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> s2;
  allocator<std::pair<const_int,_int>_> local_4a;
  key_compare local_49;
  int local_48 [2];
  pair<int,_int> local_40;
  pair<int,_int> *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> s1;
  Btree_ComparableMap_Test *this_local;
  
  local_48[1] = 1;
  local_48[0] = 2;
  s1.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)this;
  std::pair<int,_int>::pair<int,_int,_true>(&local_40,local_48 + 1,local_48);
  local_30 = 1;
  local_38 = &local_40;
  std::allocator<std::pair<const_int,_int>_>::allocator(&local_4a);
  iVar2._M_len = local_30;
  iVar2._M_array = local_38;
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
  btree_set_container((btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_28,iVar2,&local_49,&local_4a);
  std::allocator<std::pair<const_int,_int>_>::~allocator(&local_4a);
  local_98[1] = 2;
  local_98[0] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_90,local_98 + 1,local_98);
  local_88 = &local_90;
  local_80 = 1;
  this_00 = (allocator<std::pair<const_int,_int>_> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 6);
  std::allocator<std::pair<const_int,_int>_>::allocator(this_00);
  iVar1._M_len = local_80;
  iVar1._M_array = local_88;
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
  btree_set_container((btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_78,iVar1,
                      (key_compare *)
                      ((long)&gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7),this_00);
  std::allocator<std::pair<const_int,_int>_>::~allocator
            ((allocator<std::pair<const_int,_int>_> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  testing::internal::
  CmpHelperLT<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)local_b0,"s1","s2",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28,(btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_78);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar3) {
    testing::Message::Message(&local_b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::internal::
  CmpHelperLE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)local_d0,"s1","s2",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28,(btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_78);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar3) {
    testing::Message::Message(&local_d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  testing::internal::
  CmpHelperLE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)local_f0,"s1","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28,(btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar3) {
    testing::Message::Message(&local_f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  testing::internal::
  CmpHelperGT<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)local_110,"s2","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_78,(btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar3) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  testing::internal::
  CmpHelperGE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)local_130,"s2","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_78,(btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar3) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::internal::
  CmpHelperGE<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>
            ((internal *)local_150,"s1","s1",
             (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28,(btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)local_28);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar3) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x6f7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~btree_map
            ((btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_78);
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~btree_map
            ((btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28);
  return;
}

Assistant:

TEST(Btree, ComparableMap) {
        phmap::btree_map<int, int> s1 = {{1, 2}};
        phmap::btree_map<int, int> s2 = {{2, 3}};
        EXPECT_LT(s1, s2);
        EXPECT_LE(s1, s2);
        EXPECT_LE(s1, s1);
        EXPECT_GT(s2, s1);
        EXPECT_GE(s2, s1);
        EXPECT_GE(s1, s1);
    }